

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v128 __thiscall simd_test_sse4_1::c_imm_v128_shr_n_u32<8>(simd_test_sse4_1 *this,c_v128 a)

{
  undefined1 auVar1 [16];
  c_v128 cVar2;
  
  auVar1._0_8_ = CONCAT44((uint)((ulong)this >> 0x28),(uint)this >> 8);
  auVar1._8_4_ = a.u32[0] >> 8;
  auVar1._12_4_ = a.u32[1] >> 8;
  cVar2.u64[1] = auVar1._8_8_;
  cVar2.u64[0] = auVar1._0_8_;
  return cVar2;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_u32(c_v64 a, unsigned int n) {
  c_v64 t;
  if (SIMD_CHECK && n > 31) {
    fprintf(stderr, "Error: undefined u32 shift right %d\n", n);
    abort();
  }
  t.u32[1] = a.u32[1] >> n;
  t.u32[0] = a.u32[0] >> n;
  return t;
}